

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_av1.c
# Opt level: O0

uint masked_sad(uint8_t *src,int src_stride,uint8_t *a,int a_stride,uint8_t *b,int b_stride,
               uint8_t *m,int m_stride,int width,int height)

{
  int iVar1;
  int16_t pred;
  uint sad;
  int x;
  int y;
  int b_stride_local;
  uint8_t *b_local;
  int a_stride_local;
  uint8_t *a_local;
  int src_stride_local;
  uint8_t *src_local;
  
  sad = 0;
  b_local = b;
  a_local = a;
  src_local = src;
  for (y = 0; y < height; y = y + 1) {
    for (x = 0; x < width; x = x + 1) {
      iVar1 = (int)(short)((int)((uint)m[x] * (uint)a_local[x] +
                                 (0x40 - (uint)m[x]) * (uint)b_local[x] + 0x20) >> 6) -
              (uint)src_local[x];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      sad = iVar1 + sad;
    }
    src_local = src_local + src_stride;
    a_local = a_local + a_stride;
    b_local = b_local + b_stride;
    m = m + m_stride;
  }
  return sad;
}

Assistant:

static inline unsigned int masked_sad(const uint8_t *src, int src_stride,
                                      const uint8_t *a, int a_stride,
                                      const uint8_t *b, int b_stride,
                                      const uint8_t *m, int m_stride, int width,
                                      int height) {
  int y, x;
  unsigned int sad = 0;
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      const int16_t pred = AOM_BLEND_A64(m[x], a[x], b[x]);
      sad += abs(pred - src[x]);
    }
    src += src_stride;
    a += a_stride;
    b += b_stride;
    m += m_stride;
  }
  return sad;
}